

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O3

void __thiscall
rapidjson::internal::BigInteger::BigInteger(BigInteger *this,char *decimals,size_t length)

{
  long lVar1;
  RapidJSONException *this_00;
  char *begin;
  long lVar2;
  
  this->count_ = 1;
  if (length == 0) {
    this_00 = (RapidJSONException *)__cxa_allocate_exception(0x10);
    cereal::RapidJSONException::RapidJSONException
              (this_00,"rapidjson internal assertion failure: length > 0");
    __cxa_throw(this_00,&cereal::RapidJSONException::typeinfo,std::runtime_error::~runtime_error);
  }
  this->digits_[0] = 0;
  lVar2 = 0;
  begin = decimals;
  if (0x12 < length) {
    do {
      AppendDecimal64(this,begin,begin + 0x13);
      lVar1 = length + lVar2;
      lVar2 = lVar2 + -0x13;
      begin = begin + 0x13;
    } while (0x12 < lVar1 - 0x13U);
    length = length + lVar2;
    if (length == 0) {
      return;
    }
    lVar2 = -lVar2;
  }
  AppendDecimal64(this,decimals + lVar2,decimals + lVar2 + length);
  return;
}

Assistant:

BigInteger(const char* decimals, size_t length) : count_(1) {
        CEREAL_RAPIDJSON_ASSERT(length > 0);
        digits_[0] = 0;
        size_t i = 0;
        const size_t kMaxDigitPerIteration = 19;  // 2^64 = 18446744073709551616 > 10^19
        while (length >= kMaxDigitPerIteration) {
            AppendDecimal64(decimals + i, decimals + i + kMaxDigitPerIteration);
            length -= kMaxDigitPerIteration;
            i += kMaxDigitPerIteration;
        }

        if (length > 0)
            AppendDecimal64(decimals + i, decimals + i + length);
    }